

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O0

void __thiscall
FBitmap::CopyPixelDataRGB
          (FBitmap *this,int originx,int originy,BYTE *patch,int srcwidth,int srcheight,int step_x,
          int step_y,int rotate,int ct,FCopyInfo *inf,int r,int g,int b)

{
  BYTE *pBVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ECopyOp local_44;
  int local_38;
  int y;
  int op;
  BYTE *buffer;
  int srcheight_local;
  int srcwidth_local;
  BYTE *patch_local;
  int originy_local;
  int originx_local;
  FBitmap *this_local;
  
  buffer._0_4_ = srcheight;
  buffer._4_4_ = srcwidth;
  _srcheight_local = patch;
  patch_local._0_4_ = originy;
  patch_local._4_4_ = originx;
  _originy_local = this;
  bVar2 = ClipCopyPixelRect(&this->ClipRect,(int *)((long)&patch_local + 4),(int *)&patch_local,
                            (BYTE **)&srcheight_local,(int *)((long)&buffer + 4),(int *)&buffer,
                            &step_x,&step_y,rotate);
  if (bVar2) {
    pBVar1 = this->data;
    iVar4 = patch_local._4_4_ << 2;
    iVar3 = this->Pitch * (int)patch_local;
    if (inf == (FCopyInfo *)0x0) {
      local_44 = OP_COPY;
    }
    else {
      local_44 = inf->op;
    }
    for (local_38 = 0; local_38 < (int)buffer; local_38 = local_38 + 1) {
      (*copyfuncs[(int)local_44][ct])
                (pBVar1 + (long)(local_38 * this->Pitch) + (long)iVar3 + (long)iVar4,
                 _srcheight_local + local_38 * step_y,buffer._4_4_,step_x,inf,(BYTE)r,(BYTE)g,
                 (BYTE)b);
    }
  }
  return;
}

Assistant:

void FBitmap::CopyPixelDataRGB(int originx, int originy, const BYTE *patch, int srcwidth, 
							   int srcheight, int step_x, int step_y, int rotate, int ct, FCopyInfo *inf,
							   int r, int g, int b)
{
	if (ClipCopyPixelRect(&ClipRect, originx, originy, patch, srcwidth, srcheight, step_x, step_y, rotate))
	{
		BYTE *buffer = data + 4 * originx + Pitch * originy;
		int op = inf==NULL? OP_COPY : inf->op;
		for (int y=0;y<srcheight;y++)
		{
			copyfuncs[op][ct](&buffer[y*Pitch], &patch[y*step_y], srcwidth, step_x, inf, r, g, b);
		}
	}
}